

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileDefaultDefaultValue
          (NodeTranslator *this,Reader type,Builder target)

{
  OrphanBuilder local_28;
  
  if (type._reader.dataSize < 0x10) {
switchD_00183641_caseD_0:
    *(undefined2 *)target._builder.data = 0;
    return;
  }
  switch(*type._reader.data) {
  case 0:
    goto switchD_00183641_caseD_0;
  case 1:
    *(undefined2 *)target._builder.data = 1;
    *(byte *)((long)target._builder.data + 2) = *(byte *)((long)target._builder.data + 2) & 0xfe;
    break;
  case 2:
    *(undefined2 *)target._builder.data = 2;
    goto LAB_0018372e;
  case 3:
    *(undefined4 *)target._builder.data = 3;
    break;
  case 4:
    *(undefined2 *)target._builder.data = 4;
    goto LAB_00183758;
  case 5:
    *(undefined2 *)target._builder.data = 5;
    goto LAB_001836f6;
  case 6:
    *(undefined2 *)target._builder.data = 6;
LAB_0018372e:
    *(undefined1 *)((long)target._builder.data + 2) = 0;
    break;
  case 7:
    *(undefined4 *)target._builder.data = 7;
    break;
  case 8:
    *(undefined2 *)target._builder.data = 8;
    goto LAB_00183758;
  case 9:
    *(undefined2 *)target._builder.data = 9;
    goto LAB_001836f6;
  case 10:
    *(undefined2 *)target._builder.data = 10;
LAB_00183758:
    *(undefined4 *)((long)target._builder.data + 4) = 0;
    break;
  case 0xb:
    *(undefined2 *)target._builder.data = 0xb;
LAB_001836f6:
    *(undefined8 *)((long)target._builder.data + 8) = 0;
    break;
  case 0xc:
    local_28.capTable = (CapTableBuilder *)0x0;
    local_28.location = (word *)0x0;
    local_28.tag.content = 0;
    local_28.segment = (SegmentBuilder *)0x0;
    capnp::schema::Value::Builder::adoptText(&target,(Orphan<capnp::Text> *)&local_28);
    goto LAB_00183718;
  case 0xd:
    local_28.capTable = (CapTableBuilder *)0x0;
    local_28.location = (word *)0x0;
    local_28.tag.content = 0;
    local_28.segment = (SegmentBuilder *)0x0;
    capnp::schema::Value::Builder::adoptData(&target,(Orphan<capnp::Data> *)&local_28);
LAB_00183718:
    _::OrphanBuilder::~OrphanBuilder(&local_28);
    break;
  case 0xe:
    capnp::schema::Value::Builder::initList((Builder *)&local_28,&target);
    break;
  case 0xf:
    *(undefined4 *)target._builder.data = 0xf;
    break;
  case 0x10:
    capnp::schema::Value::Builder::initStruct((Builder *)&local_28,&target);
    break;
  case 0x11:
    *(undefined2 *)target._builder.data = 0x11;
    break;
  case 0x12:
    capnp::schema::Value::Builder::initAnyPointer((Builder *)&local_28,&target);
  }
  return;
}

Assistant:

void NodeTranslator::compileDefaultDefaultValue(
    schema::Type::Reader type, schema::Value::Builder target) {
  switch (type.which()) {
    case schema::Type::VOID: target.setVoid(); break;
    case schema::Type::BOOL: target.setBool(false); break;
    case schema::Type::INT8: target.setInt8(0); break;
    case schema::Type::INT16: target.setInt16(0); break;
    case schema::Type::INT32: target.setInt32(0); break;
    case schema::Type::INT64: target.setInt64(0); break;
    case schema::Type::UINT8: target.setUint8(0); break;
    case schema::Type::UINT16: target.setUint16(0); break;
    case schema::Type::UINT32: target.setUint32(0); break;
    case schema::Type::UINT64: target.setUint64(0); break;
    case schema::Type::FLOAT32: target.setFloat32(0); break;
    case schema::Type::FLOAT64: target.setFloat64(0); break;
    case schema::Type::ENUM: target.setEnum(0); break;
    case schema::Type::INTERFACE: target.setInterface(); break;

    // Bit of a hack:  For Text/Data, we adopt a null orphan, which sets the field to null.
    // TODO(cleanup):  Create a cleaner way to do this.
    case schema::Type::TEXT: target.adoptText(Orphan<Text>()); break;
    case schema::Type::DATA: target.adoptData(Orphan<Data>()); break;
    case schema::Type::STRUCT: target.initStruct(); break;
    case schema::Type::LIST: target.initList(); break;
    case schema::Type::ANY_POINTER: target.initAnyPointer(); break;
  }
}